

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O2

int cdef_find_dir_c(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  int (*paiVar4) [15];
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  int *piVar10;
  int j;
  ulong uVar11;
  long lVar12;
  int *__s;
  int aiStack_308 [46];
  undefined8 uStack_250;
  int local_248 [10];
  int *local_220;
  int partial [8] [15];
  
  piVar8 = local_248;
  local_248[4] = 0;
  local_248[5] = 0;
  local_248[6] = 0;
  local_248[7] = 0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  local_248[3] = 0;
  __s = partial[0];
  uStack_250 = 0x324a45;
  local_220 = var;
  memset(__s,0,0x1e0);
  piVar7 = partial[4] + 7;
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    uVar9 = lVar12 * 2 & 0xfffffffffffffffc;
    piVar10 = piVar7;
    for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
      iVar6 = (img[uVar11] >> ((byte)coeff_shift & 0x1f)) - 0x80;
      __s[uVar11] = __s[uVar11] + iVar6;
      uVar2 = (uint)(uVar11 >> 1) & 0x7fffffff;
      partial[1][uVar2 + (int)lVar12] = partial[1][uVar2 + (int)lVar12] + iVar6;
      partial[2][lVar12] = partial[2][lVar12] + iVar6;
      partial[3][((int)lVar12 + 3) - uVar2] = partial[3][((int)lVar12 + 3) - uVar2] + iVar6;
      *piVar10 = *piVar10 + iVar6;
      piVar1 = (int *)((long)partial + (uVar11 * 4 - uVar9) + 0x138);
      *piVar1 = *piVar1 + iVar6;
      partial[6][uVar11] = partial[6][uVar11] + iVar6;
      piVar1 = (int *)((long)partial[7] + uVar11 * 4 + uVar9);
      *piVar1 = *piVar1 + iVar6;
      piVar10 = piVar10 + -1;
    }
    img = img + stride;
    piVar7 = piVar7 + 1;
    __s = __s + 1;
  }
  iVar6 = 0;
  uStack_250 = 0x5a;
  iVar5 = 0;
  for (lVar12 = 0x5a; lVar12 != 0x62; lVar12 = lVar12 + 1) {
    iVar5 = iVar5 + aiStack_308[lVar12] * aiStack_308[lVar12];
    iVar6 = iVar6 + partial[0][lVar12] * partial[0][lVar12];
  }
  local_248[2] = iVar5 * 0x69;
  local_248[6] = iVar6 * 0x69;
  uStack_250 = 0x4a;
  lVar12 = 0x4a;
  iVar6 = 0;
  iVar5 = 0;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    iVar5 = iVar5 + (aiStack_308[lVar12] * aiStack_308[lVar12] +
                    partial[0][lVar3] * partial[0][lVar3]) * cdef_find_dir_c::div_table[lVar3 + 1];
    iVar6 = iVar6 + (partial[0][lVar12] * partial[0][lVar12] + partial[4][lVar3] * partial[4][lVar3]
                    ) * cdef_find_dir_c::div_table[lVar3 + 1];
    lVar12 = lVar12 + -1;
  }
  paiVar4 = partial;
  local_248[0] = partial[0][7] * partial[0][7] * 0x69 + iVar5;
  local_248[4] = partial[4][7] * partial[4][7] * 0x69 + iVar6;
  uStack_250 = 0x19;
  for (uVar9 = 1; piVar8 = (int *)((long)piVar8 + 0x78), uVar9 < 8; uVar9 = uVar9 + 2) {
    iVar6 = local_248[uVar9];
    for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
      iVar6 = iVar6 + *(int *)((long)piVar8 + lVar12 * 4) * *(int *)((long)piVar8 + lVar12 * 4);
    }
    iVar6 = iVar6 * 0x69;
    lVar12 = 0x19;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      iVar6 = iVar6 + ((*paiVar4)[lVar12] * (*paiVar4)[lVar12] +
                      paiVar4[1][lVar3] * paiVar4[1][lVar3]) *
                      cdef_find_dir_c::div_table[lVar3 * 2 + 2];
      lVar12 = lVar12 + -1;
    }
    local_248[uVar9] = iVar6;
    paiVar4 = paiVar4 + 2;
  }
  iVar6 = 0;
  uVar9 = 0;
  for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
    if (iVar6 < local_248[uVar11]) {
      uVar9 = uVar11 & 0xffffffff;
      iVar6 = local_248[uVar11];
    }
  }
  *local_220 = iVar6 - local_248[(uint)uVar9 & 7 ^ 4] >> 10;
  return (uint)uVar9;
}

Assistant:

int cdef_find_dir_c(const uint16_t *img, int stride, int32_t *var,
                    int coeff_shift) {
  int i;
  int32_t cost[8] = { 0 };
  int partial[8][15] = { { 0 } };
  int32_t best_cost = 0;
  int best_dir = 0;
  /* Instead of dividing by n between 2 and 8, we multiply by 3*5*7*8/n.
     The output is then 840 times larger, but we don't care for finding
     the max. */
  static const int div_table[] = { 0, 840, 420, 280, 210, 168, 140, 120, 105 };
  for (i = 0; i < 8; i++) {
    int j;
    for (j = 0; j < 8; j++) {
      int x;
      /* We subtract 128 here to reduce the maximum range of the squared
         partial sums. */
      x = (img[i * stride + j] >> coeff_shift) - 128;
      partial[0][i + j] += x;
      partial[1][i + j / 2] += x;
      partial[2][i] += x;
      partial[3][3 + i - j / 2] += x;
      partial[4][7 + i - j] += x;
      partial[5][3 - i / 2 + j] += x;
      partial[6][j] += x;
      partial[7][i / 2 + j] += x;
    }
  }
  for (i = 0; i < 8; i++) {
    cost[2] += partial[2][i] * partial[2][i];
    cost[6] += partial[6][i] * partial[6][i];
  }
  cost[2] *= div_table[8];
  cost[6] *= div_table[8];
  for (i = 0; i < 7; i++) {
    cost[0] += (partial[0][i] * partial[0][i] +
                partial[0][14 - i] * partial[0][14 - i]) *
               div_table[i + 1];
    cost[4] += (partial[4][i] * partial[4][i] +
                partial[4][14 - i] * partial[4][14 - i]) *
               div_table[i + 1];
  }
  cost[0] += partial[0][7] * partial[0][7] * div_table[8];
  cost[4] += partial[4][7] * partial[4][7] * div_table[8];
  for (i = 1; i < 8; i += 2) {
    int j;
    for (j = 0; j < 4 + 1; j++) {
      cost[i] += partial[i][3 + j] * partial[i][3 + j];
    }
    cost[i] *= div_table[8];
    for (j = 0; j < 4 - 1; j++) {
      cost[i] += (partial[i][j] * partial[i][j] +
                  partial[i][10 - j] * partial[i][10 - j]) *
                 div_table[2 * j + 2];
    }
  }
  for (i = 0; i < 8; i++) {
    if (cost[i] > best_cost) {
      best_cost = cost[i];
      best_dir = i;
    }
  }
  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}